

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

int lj_cconv_compatptr(CTState *cts,CType *d,CType *s,CTInfo flags)

{
  int iVar1;
  CTState *cts_00;
  uint in_ECX;
  CTState *in_RDX;
  CTState *in_RSI;
  CTState *in_RDI;
  CTInfo squal;
  CTInfo dqual;
  uint flags_00;
  uint uVar2;
  
  if (((in_ECX & 1) == 0) && (in_RSI != in_RDX)) {
    uVar2 = 0;
    flags_00 = 0;
    cts_00 = (CTState *)cconv_childqual(in_RDI,(CType *)in_RSI,(CTInfo *)&stack0xffffffffffffffd8);
    if (*(uint *)&in_RDX->tab >> 0x1c != 1) {
      in_RDX = (CTState *)cconv_childqual(in_RDI,(CType *)in_RDX,(CTInfo *)&stack0xffffffffffffffd4)
      ;
    }
    if ((in_ECX & 4) == 0) {
      if ((in_ECX & 8) == 0) {
        if ((uVar2 & flags_00) != flags_00) {
          return 0;
        }
        if ((*(uint *)&cts_00->tab >> 0x1c == 4) || (*(uint *)&in_RDX->tab >> 0x1c == 4)) {
          return 1;
        }
      }
    }
    else if (uVar2 != flags_00) {
      return 0;
    }
    if ((*(uint *)&cts_00->tab >> 0x1c != *(uint *)&in_RDX->tab >> 0x1c) ||
       (*(CTSize *)((long)&cts_00->tab + 4) != *(CTSize *)((long)&in_RDX->tab + 4))) {
      return 0;
    }
    if (*(uint *)&cts_00->tab >> 0x1c == 0) {
      if (((*(uint *)&cts_00->tab ^ *(uint *)&in_RDX->tab) & 0xc000000) != 0) {
        return 0;
      }
    }
    else {
      if (*(uint *)&cts_00->tab >> 0x1d == 1) {
        iVar1 = lj_cconv_compatptr(cts_00,(CType *)in_RDX,(CType *)CONCAT44(in_ECX,uVar2),flags_00);
        return iVar1;
      }
      if ((*(uint *)&cts_00->tab >> 0x1c == 1) && (cts_00 != in_RDX)) {
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

int lj_cconv_compatptr(CTState *cts, CType *d, CType *s, CTInfo flags)
{
  if (!((flags & CCF_CAST) || d == s)) {
    CTInfo dqual = 0, squal = 0;
    d = cconv_childqual(cts, d, &dqual);
    if (!ctype_isstruct(s->info))
      s = cconv_childqual(cts, s, &squal);
    if ((flags & CCF_SAME)) {
      if (dqual != squal)
	return 0;  /* Different qualifiers. */
    } else if (!(flags & CCF_IGNQUAL)) {
      if ((dqual & squal) != squal)
	return 0;  /* Discarded qualifiers. */
      if (ctype_isvoid(d->info) || ctype_isvoid(s->info))
	return 1;  /* Converting to/from void * is always ok. */
    }
    if (ctype_type(d->info) != ctype_type(s->info) ||
	d->size != s->size)
      return 0;  /* Different type or different size. */
    if (ctype_isnum(d->info)) {
      if (((d->info ^ s->info) & (CTF_BOOL|CTF_FP)))
	return 0;  /* Different numeric types. */
    } else if (ctype_ispointer(d->info)) {
      /* Check child types for compatibility. */
      return lj_cconv_compatptr(cts, d, s, flags|CCF_SAME);
    } else if (ctype_isstruct(d->info)) {
      if (d != s)
	return 0;  /* Must be exact same type for struct/union. */
    } else if (ctype_isfunc(d->info)) {
      /* NYI: structural equality of functions. */
    }
  }
  return 1;  /* Types are compatible. */
}